

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledCallIExtendedWithICIndex<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  ProfileId profileId;
  InlineCacheIndex inlineCacheIndex;
  uint offset;
  Var target;
  RecyclableObject *function;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *local_40;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  target = GetRegAllowStackVar<unsigned_char>
                     (this,(playout->
                           super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                           ).super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                           .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>.Function
                     );
  function = OP_CallGetFunc(this,target);
  profileId = playout->profileId;
  inlineCacheIndex =
       (playout->super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)
       .inlineCacheIndex;
  if (((playout->super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)
       .super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>.Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    local_40 = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    offset = (playout->
             super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>).
             super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>.SpreadAuxOffset
    ;
    functionBody = GetFunctionBody(this);
    local_40 = ByteCodeReader::ReadAuxArray<unsigned_int>(offset,functionBody);
  }
  OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
            (this,playout,function,0,profileId,inlineCacheIndex,local_40);
  return;
}

Assistant:

void OP_ProfiledCallIExtendedWithICIndex(const unaligned OpLayoutDynamicProfile<T>* playout) { OP_ProfileCallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, playout->profileId, playout->inlineCacheIndex, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }